

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>
                   (string *__return_storage_ptr__,char (*a) [30],bool *b,char (*args) [2],
                   char (*args_1) [42],bool *args_2,char (*args_3) [2],char (*args_4) [43],
                   bool *args_5,char (*args_6) [2],char (*args_7) [37],bool *args_8,
                   char (*args_9) [2],char (*args_10) [34],bool *args_11,char (*args_12) [2])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_4e0;
  cmAlphaNum local_4a8;
  cmAlphaNum local_470;
  cmAlphaNum local_438;
  cmAlphaNum local_400;
  cmAlphaNum local_3c8;
  cmAlphaNum local_390;
  cmAlphaNum local_358;
  cmAlphaNum local_320;
  cmAlphaNum local_2e8;
  cmAlphaNum local_2b0;
  cmAlphaNum local_278;
  cmAlphaNum local_240;
  cmAlphaNum local_208;
  cmAlphaNum local_1d0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_198;
  string_view local_180;
  string *local_170;
  string_view local_168;
  string *local_158;
  string_view local_150;
  string *local_140;
  string_view local_138;
  string *local_128;
  string_view local_120;
  string *local_110;
  string_view local_108;
  string *local_f8;
  string_view local_f0;
  string *local_e0;
  string_view local_d8;
  string *local_c8;
  string_view local_c0;
  string *local_b0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  cmAlphaNum::cmAlphaNum(&local_1d0,*a);
  local_198.first = cmAlphaNum::View(&local_1d0);
  local_198.second = local_1d0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_208,(uint)*b);
  local_180 = cmAlphaNum::View(&local_208);
  local_170 = local_208.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_240,*args);
  local_168 = cmAlphaNum::View(&local_240);
  local_158 = local_240.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_278,*args_1);
  local_150 = cmAlphaNum::View(&local_278);
  local_140 = local_278.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_2b0,(uint)*args_2);
  local_138 = cmAlphaNum::View(&local_2b0);
  local_128 = local_2b0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_2e8,*args_3);
  local_120 = cmAlphaNum::View(&local_2e8);
  local_110 = local_2e8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_320,*args_4);
  local_108 = cmAlphaNum::View(&local_320);
  local_f8 = local_320.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_358,(uint)*args_5);
  local_f0 = cmAlphaNum::View(&local_358);
  local_e0 = local_358.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_390,*args_6);
  local_d8 = cmAlphaNum::View(&local_390);
  local_c8 = local_390.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_3c8,*args_7);
  local_c0 = cmAlphaNum::View(&local_3c8);
  local_b0 = local_3c8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_400,(uint)*args_8);
  local_a8 = cmAlphaNum::View(&local_400);
  local_98 = local_400.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_438,*args_9);
  local_90 = cmAlphaNum::View(&local_438);
  local_80 = local_438.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_470,*args_10);
  local_78 = cmAlphaNum::View(&local_470);
  local_68 = local_470.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_4a8,(uint)*args_11);
  local_60 = cmAlphaNum::View(&local_4a8);
  local_50 = local_4a8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_4e0,*args_12);
  local_48 = cmAlphaNum::View(&local_4e0);
  local_38 = local_4e0.RValueString_;
  views._M_len = 0xf;
  views._M_array = &local_198;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}